

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vli_size.c
# Opt level: O0

uint32_t lzma_vli_size(lzma_vli vli)

{
  uint local_1c;
  lzma_vli lStack_18;
  uint32_t i;
  lzma_vli vli_local;
  
  if (vli < 0x8000000000000000) {
    local_1c = 0;
    lStack_18 = vli;
    do {
      lStack_18 = lStack_18 >> 7;
      local_1c = local_1c + 1;
    } while (lStack_18 != 0);
    vli_local._4_4_ = local_1c;
    if (9 < local_1c) {
      __assert_fail("i <= LZMA_VLI_BYTES_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/vli_size.c"
                    ,0x1c,"uint32_t lzma_vli_size(lzma_vli)");
    }
  }
  else {
    vli_local._4_4_ = 0;
  }
  return vli_local._4_4_;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_vli_size(lzma_vli vli)
{
	if (vli > LZMA_VLI_MAX)
		return 0;

	uint32_t i = 0;
	do {
		vli >>= 7;
		++i;
	} while (vli != 0);

	assert(i <= LZMA_VLI_BYTES_MAX);
	return i;
}